

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.cpp
# Opt level: O3

Class * __thiscall camp::Class::base(Class *this,size_t index)

{
  pointer pBVar1;
  OutOfRange *__return_storage_ptr__;
  string local_b0;
  string local_90;
  OutOfRange local_70;
  
  pBVar1 = (this->m_bases).
           super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (index < (ulong)((long)(this->m_bases).
                            super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar1 >> 4)) {
    return pBVar1[index].base;
  }
  __return_storage_ptr__ = (OutOfRange *)__cxa_allocate_exception(0x48);
  OutOfRange::OutOfRange
            (&local_70,index,
             (long)(this->m_bases).
                   super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_bases).
                   super__Vector_base<camp::Class::BaseInfo,_std::allocator<camp::Class::BaseInfo>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/class.cpp"
             ,"");
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,"const Class &camp::Class::base(std::size_t) const","");
  Error::prepare<camp::OutOfRange>(__return_storage_ptr__,&local_70,&local_b0,0x38,&local_90);
  __cxa_throw(__return_storage_ptr__,&OutOfRange::typeinfo,Error::~Error);
}

Assistant:

const Class& Class::base(std::size_t index) const
{
    // Make sure that the index is not out of range
    if (index >= m_bases.size())
        CAMP_ERROR(OutOfRange(index, m_bases.size()));

    return *m_bases[index].base;
}